

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive-solver.hpp
# Opt level: O2

int __thiscall
baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::
solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data[]>>>
          (exhaustive_solver<baryonyx::itm::maximize_tag,long_double> *this,int k,
          unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
          *reduced_cost,int r_size)

{
  undefined8 uVar1;
  int iVar2;
  rc_data *prVar3;
  long lVar4;
  item *piVar5;
  uint uVar6;
  iterator iVar7;
  __normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::item_*,_std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>_>
  _Var8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  size_type __new_size;
  bool bVar14;
  longdouble lVar15;
  longdouble lVar16;
  longdouble lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  key_type local_3c;
  
  local_3c.bk_min = 0;
  local_3c.bk_max = 0;
  local_3c.k = k;
  iVar7 = std::
          _Rb_tree<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::constraint,_baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::constraint,_std::_Identity<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::constraint>,_std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::constraint>,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::constraint>_>
          ::find((_Rb_tree<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::constraint,_baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::constraint,_std::_Identity<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::constraint>,_std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::constraint>,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::constraint>_>
                  *)(this + 0x48),&local_3c);
  if (iVar7._M_node != (_Base_ptr)(this + 0x50)) {
    __new_size = (size_type)r_size;
    std::
    vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
    ::resize((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
              *)this,__new_size);
    prVar3 = (reduced_cost->_M_t).
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
             ._M_head_impl;
    lVar4 = *(long *)this;
    for (lVar9 = 0; (ulong)(uint)r_size << 5 != lVar9; lVar9 = lVar9 + 0x20) {
      *(unkbyte10 *)(lVar4 + lVar9) = *(unkbyte10 *)((long)&prVar3->value + lVar9);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)((long)&prVar3->id + lVar9);
      auVar19 = vshufps_avx(auVar18,auVar18,0xe1);
      uVar1 = vmovlps_avx(auVar19);
      *(undefined8 *)(lVar4 + 0x10 + lVar9) = uVar1;
      *(undefined4 *)(lVar4 + 0x18 + lVar9) = 0;
    }
    iVar2 = *(int *)&iVar7._M_node[1].field_0x4;
    lVar4 = *(long *)(this + 0x18);
    prVar3 = (reduced_cost->_M_t).
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
             ._M_head_impl;
    lVar9 = (ulong)(uint)r_size << 2;
    lVar16 = (longdouble)0;
    for (lVar11 = 0; lVar9 != lVar11; lVar11 = lVar11 + 4) {
      if (*(int *)(lVar4 + (long)iVar2 * 4 + lVar11) != 0) {
        lVar16 = *(longdouble *)((long)&prVar3->value + lVar11 * 8) + lVar16;
      }
    }
    uVar10 = 0;
    lVar11 = (long)iVar2 * 4 + __new_size * 4 + lVar4;
    for (uVar12 = 1; uVar12 != *(uint *)&iVar7._M_node[1]._M_parent; uVar12 = uVar12 + 1) {
      lVar17 = (longdouble)0;
      for (lVar13 = 0; lVar9 != lVar13; lVar13 = lVar13 + 4) {
        if (*(int *)(lVar11 + lVar13) != 0) {
          lVar17 = *(longdouble *)((long)&prVar3->value + lVar13 * 8) + lVar17;
        }
      }
      lVar15 = lVar16;
      if (lVar16 <= lVar17 || lVar17 != lVar16) {
        lVar15 = lVar17;
      }
      if (lVar16 < lVar17) {
        uVar10 = uVar12 & 0xffffffff;
      }
      lVar11 = lVar11 + __new_size * 4;
      lVar16 = lVar15;
    }
    lVar11 = *(long *)this;
    for (lVar13 = 0; lVar9 != lVar13; lVar13 = lVar13 + 4) {
      *(uint *)(lVar11 + 0x18 + lVar13 * 8) =
           (uint)(*(int *)(lVar4 + (long)((int)uVar10 * r_size + iVar2) * 4 + lVar13) != 0);
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::item*,std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::item>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data[]>>>(int,std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data[]>>&,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (*(undefined8 *)this,*(undefined8 *)(this + 8));
    _Var8 = std::
            __find_if<__gnu_cxx::__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::item*,std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::item>>>,__gnu_cxx::__ops::_Iter_pred<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,long_double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data[]>>>(int,std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data[]>>&,int)::_lambda(auto:1_const&)_1_>>
                      (*(undefined8 *)this,*(undefined8 *)(this + 8));
    piVar5 = *(item **)(this + 8);
    lVar4 = *(long *)this;
    prVar3 = (reduced_cost->_M_t).
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
             ._M_head_impl;
    lVar11 = (long)piVar5 - lVar4 >> 5;
    lVar9 = 0x10;
    while (bVar14 = lVar11 != 0, lVar11 = lVar11 + -1, bVar14) {
      *(unkbyte10 *)((long)prVar3 + lVar9 + -0x10) = *(unkbyte10 *)(lVar4 + -0x10 + lVar9);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)(lVar4 + lVar9);
      auVar19 = vshufps_avx(auVar19,auVar19,0xe1);
      uVar1 = vmovlps_avx(auVar19);
      *(undefined8 *)((long)&prVar3->value + lVar9) = uVar1;
      lVar9 = lVar9 + 0x20;
    }
    if (_Var8._M_current == piVar5) {
      uVar6 = -(uint)(*(int *)(lVar4 + 0x18) == 0) | r_size;
    }
    else {
      uVar6 = (int)((ulong)((long)_Var8._M_current - lVar4) >> 5) - 1;
    }
    return uVar6;
  }
  details::fail_fast("Precondition","it_constraint != constraints.end()",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/exhaustive-solver.hpp"
                     ,"189");
}

Assistant:

int solve(int k, R& reduced_cost, int r_size)
    {
        const auto it_constraint = constraints.find(k);
        bx_expects(it_constraint != constraints.end());

        items.resize(r_size);
        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].factor = reduced_cost[i].f;
            items[i].result = 0;
        }

        Float z_best = 0;
        auto best = 0;
        auto start_solution = it_constraint->start;

        for (int j = 0; j != r_size; ++j)
            if (flat_constraints[start_solution + j])
                z_best += reduced_cost[j].value;

        for (auto i = 1; i != it_constraint->solutions; ++i) {
            start_solution = it_constraint->start + (i * r_size);

            Float z = 0;
            for (int j = 0; j != r_size; ++j)
                if (flat_constraints[start_solution + j])
                    z += reduced_cost[j].value;

            if (is_best_solution(z, z_best)) {
                z_best = z;
                best = i;
            }
        }

        start_solution = it_constraint->start + (best * r_size);
        for (int i = 0; i != r_size; ++i)
            items[i].result = flat_constraints[start_solution + i] ? 1 : 0;

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }